

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynWhile * ParseWhile(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  Lexeme *pLVar2;
  Lexeme *end;
  SynBase *body_00;
  SynBase *body;
  SynBase *condition;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_while);
  if (bVar1) {
    anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'while\'");
    body = ParseAssignment(ctx);
    if (body == (SynBase *)0x0) {
      pLVar2 = ParseContext::Current(ctx);
      anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: expression expected after \'while(\'");
      body = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar2 = ParseContext::Current(ctx);
      end = ParseContext::Current(ctx);
      SynError::SynError((SynError *)body,pLVar2,end);
    }
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_cparen,
               "ERROR: closing \')\' not found after expression in \'while\' statement");
    body_00 = ParseExpression(ctx);
    if (body_00 == (SynBase *)0x0) {
      bVar1 = ParseContext::Consume(ctx,lex_semicolon);
      if (!bVar1) {
        pLVar2 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: body not found after \'while\' header");
      }
    }
    ctx_local = (ParseContext *)ParseContext::get<SynWhile>(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    SynWhile::SynWhile((SynWhile *)ctx_local,begin,pLVar2,body,body_00);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynWhile *)ctx_local;
}

Assistant:

SynWhile* ParseWhile(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_while))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'while'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: expression expected after 'while('");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after expression in 'while' statement");

		SynBase *body = ParseExpression(ctx);

		if(!body && !ctx.Consume(lex_semicolon))
			Report(ctx, ctx.Current(), "ERROR: body not found after 'while' header");

		return new (ctx.get<SynWhile>()) SynWhile(start, ctx.Previous(), condition, body);
	}

	return NULL;
}